

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O1

void __thiscall btDbvtBroadphase::resetPool(btDbvtBroadphase *this,btDispatcher *dispatcher)

{
  if (*(int *)&this->field_0x1c + *(int *)&this->field_0x7c == 0) {
    btDbvt::clear((btDbvt *)&this->field_0x8);
    btDbvt::clear((btDbvt *)&this->field_0x68);
    this->m_deferedcollide = false;
    this->m_needcleanup = true;
    this->m_stageCurrent = 0;
    this->m_fupdates = 1;
    this->m_dupdates = 0;
    this->m_cupdates = 10;
    this->m_newpairs = 1;
    this->m_fixedleft = 0;
    this->m_stageRoots[0] = (btDbvtProxy *)0x0;
    this->m_stageRoots[1] = (btDbvtProxy *)0x0;
    this->m_stageRoots[2] = (btDbvtProxy *)0x0;
    this->m_updates_call = 0;
    this->m_updates_done = 0;
    this->m_updates_ratio = 0.0;
    this->m_pid = 0;
    this->m_cid = 0;
    this->m_gid = 0;
  }
  return;
}

Assistant:

void btDbvtBroadphase::resetPool(btDispatcher* dispatcher)
{
	
	int totalObjects = m_sets[0].m_leaves + m_sets[1].m_leaves;
	if (!totalObjects)
	{
		//reset internal dynamic tree data structures
		m_sets[0].clear();
		m_sets[1].clear();
		
		m_deferedcollide	=	false;
		m_needcleanup		=	true;
		m_stageCurrent		=	0;
		m_fixedleft			=	0;
		m_fupdates			=	1;
		m_dupdates			=	0;
		m_cupdates			=	10;
		m_newpairs			=	1;
		m_updates_call		=	0;
		m_updates_done		=	0;
		m_updates_ratio		=	0;
		
		m_gid				=	0;
		m_pid				=	0;
		m_cid				=	0;
		for(int i=0;i<=STAGECOUNT;++i)
		{
			m_stageRoots[i]=0;
		}
	}
}